

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_ForwardReferencedChild_Test::TestBody(TypeTest_ForwardReferencedChild_Test *this)

{
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  bool bVar1;
  HeapType HVar2;
  Type type;
  char *pcVar3;
  char *in_R9;
  Entry EVar4;
  AssertHelper local_280;
  Message local_278;
  uint local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_1;
  Message local_250;
  ErrorReason local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar;
  string local_228;
  AssertHelper local_208;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__1;
  Error *error;
  AssertHelper local_1c0;
  Message local_1b8;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Struct local_168;
  Entry local_148;
  allocator<wasm::Field> local_131;
  uintptr_t local_130;
  Field local_128;
  iterator local_118;
  size_type local_110;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_108;
  Struct local_f0;
  Entry local_d8;
  allocator<wasm::Field> local_c1;
  uintptr_t local_c0;
  Field local_b8;
  iterator local_a8;
  size_type local_a0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_98;
  Struct local_80;
  Entry local_68;
  uintptr_t local_58;
  Type local_50;
  Type refB0;
  Type refA1;
  TypeBuilder local_18;
  TypeBuilder builder;
  TypeTest_ForwardReferencedChild_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  ::wasm::TypeBuilder::TypeBuilder(&local_18,3);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_18,0);
  EVar4 = ::wasm::TypeBuilder::operator[](&local_18,1);
  refB0.id = (uintptr_t)EVar4.builder;
  HVar2 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refB0);
  type.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)HVar2.id,Exact);
  local_68 = ::wasm::TypeBuilder::operator[](&local_18,2);
  local_58 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_68);
  local_50.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_18,(Nullability)local_58,Exact)
  ;
  local_c0 = type.id;
  ::wasm::Field::Field(&local_b8,type,Mutable);
  local_a8 = &local_b8;
  local_a0 = 1;
  std::allocator<wasm::Field>::allocator(&local_c1);
  __l_00._M_len = local_a0;
  __l_00._M_array = local_a8;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_98,__l_00,&local_c1);
  ::wasm::Struct::Struct(&local_80,&local_98);
  local_d8 = ::wasm::TypeBuilder::operator[](&local_18,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_d8,&local_80);
  ::wasm::Struct::~Struct(&local_80);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_98);
  std::allocator<wasm::Field>::~allocator(&local_c1);
  local_130 = local_50.id;
  ::wasm::Field::Field(&local_128,local_50,Mutable);
  local_118 = &local_128;
  local_110 = 1;
  std::allocator<wasm::Field>::allocator(&local_131);
  __l._M_len = local_110;
  __l._M_array = local_118;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_108,__l,&local_131);
  ::wasm::Struct::Struct(&local_f0,&local_108);
  local_148 = ::wasm::TypeBuilder::operator[](&local_18,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_148,&local_f0);
  ::wasm::Struct::~Struct(&local_f0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_108);
  std::allocator<wasm::Field>::~allocator(&local_131);
  local_168.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_168);
  EVar4 = ::wasm::TypeBuilder::operator[](&local_18,2);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar4.builder;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_168);
  ::wasm::Struct::~Struct(&local_168);
  ::wasm::TypeBuilder::build();
  bVar1 = ::wasm::TypeBuilder::BuildResult::operator_cast_to_bool
                    ((BuildResult *)&gtest_ar_.message_);
  local_1a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error,(internal *)local_1a8,(AssertionResult *)0x4945b1,"true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x13e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&error);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::wasm::TypeBuilder::BuildResult::getError((BuildResult *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::Error_const*>
            ((AssertionResult *)local_1f8,(Error **)&gtest_ar__1.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_228,(internal *)local_1f8,(AssertionResult *)0x4a2453,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    testing::Message::~Message(&local_200);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_244 = ForwardChildReference;
    testing::internal::EqHelper::
    Compare<wasm::TypeBuilder::ErrorReason,_wasm::TypeBuilder::ErrorReason,_nullptr>
              ((EqHelper *)local_240,"error->reason",
               "TypeBuilder::ErrorReason::ForwardChildReference",
               (ErrorReason *)
               ((long)gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 8),&local_244);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x142,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_250);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    local_26c = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_268,"error->index","1u",
               (unsigned_long *)
               gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,&local_26c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x143,pcVar3);
      testing::internal::AssertHelper::operator=(&local_280,&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(TypeTest, ForwardReferencedChild) {
  TypeBuilder builder(3);
  builder.createRecGroup(0, 2);
  Type refA1 = builder.getTempRefType(builder[1], Nullable);
  Type refB0 = builder.getTempRefType(builder[2], Nullable);
  // Forward reference to same group is ok.
  builder[0] = Struct({Field(refA1, Mutable)});
  // Forward reference to different group is not ok.
  builder[1] = Struct({Field(refB0, Mutable)});
  builder[2] = Struct{};

  auto result = builder.build();
  EXPECT_FALSE(result);

  const auto* error = result.getError();
  ASSERT_TRUE(error);
  EXPECT_EQ(error->reason, TypeBuilder::ErrorReason::ForwardChildReference);
  EXPECT_EQ(error->index, 1u);
}